

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O1

bool __thiscall DAGPropagator::propagate(DAGPropagator *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  bool bVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_5a;
  bool local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)(int)(this->super_DReachabilityPropagator).super_GraphPropagator.es.sz,
             &local_59,&local_5a);
  this_00 = &this->processed_e;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&this_00->super__Bvector_base<std::allocator<bool>_>);
  (this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._12_4_,
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_offset);
  (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  *(ulong *)&(this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._12_4_,
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_offset);
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)(int)(this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz,
             &local_59,&local_5a);
  this_01 = &this->processed_n;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&this_01->super__Bvector_base<std::allocator<bool>_>);
  (this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._12_4_,
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_offset);
  (this_01->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  *(ulong *)&(this->processed_n).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._12_4_,
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_offset);
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  bVar1 = DReachabilityPropagator::propagate(&this->super_DReachabilityPropagator);
  if (bVar1) {
    for (p_Var3 = (this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      uVar5 = (ulong)(int)p_Var3[1]._M_color;
      uVar4 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar4 = uVar5;
      }
      if ((((this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar4 >> 6) +
             (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
            (uVar5 & 0x3f) & 1) == 0) &&
         (iVar2 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                    _vptr_Propagator[0x11])(this), (char)iVar2 == '\0')) goto LAB_00182b88;
    }
    bVar1 = true;
    for (p_Var3 = (this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      uVar5 = (ulong)(int)p_Var3[1]._M_color;
      uVar4 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar4 = uVar5;
      }
      if ((((this_01->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar4 >> 6) +
             (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
            (uVar5 & 0x3f) & 1) == 0) &&
         (iVar2 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                    _vptr_Propagator[0x14])(this), (char)iVar2 == '\0')) goto LAB_00182b88;
    }
  }
  else {
LAB_00182b88:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DAGPropagator::propagate() {
	processed_e = std::vector<bool>(nbEdges(), false);
	processed_n = std::vector<bool>(nbNodes(), false);

	if (!DReachabilityPropagator::propagate()) {
		return false;
	}

	std::set<int>::iterator it;

	for (it = new_edge.begin(); it != new_edge.end(); ++it) {
		if (!processed_e[*it]) {
			if (!propagateNewEdge(*it)) {
				return false;
			}
		}
	}

	for (it = new_node.begin(); it != new_node.end(); ++it) {
		if (!processed_n[*it]) {
			if (!propagateNewNode(*it)) {
				return false;
			}
		}
	}

	return true;
}